

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::testGroupEnded(JunitReporter *this,TestGroupStats *testGroupStats)

{
  double suiteTime;
  
  suiteTime = Timer::getElapsedSeconds(&this->suiteTimer);
  CumulativeReporterBase::testGroupEnded(&this->super_CumulativeReporterBase,testGroupStats);
  writeGroup(this,(this->super_CumulativeReporterBase).m_testGroups.
                  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,suiteTime);
  return;
}

Assistant:

void JunitReporter::testGroupEnded(TestGroupStats const &testGroupStats) {
        double suiteTime = suiteTimer.getElapsedSeconds();
        CumulativeReporterBase::testGroupEnded(testGroupStats);
        writeGroup(*m_testGroups.back(), suiteTime);
    }